

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_BFCI(DisasContext_conflict1 *s,arg_BFCI *a)

{
  uint ofs;
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  TCGTemp *pTVar3;
  uintptr_t o;
  TCGv_i32 var;
  uint len;
  TCGv_i32 local_48;
  
  uVar2 = s->features;
  if ((uVar2 & 0x40) != 0) {
    ofs = a->lsb;
    if (a->msb < (int)ofs) {
      unallocated_encoding_aarch64(s);
    }
    else {
      s_00 = s->uc->tcg_ctx;
      len = (a->msb - ofs) + 1;
      iVar1 = a->rn;
      if (iVar1 == 0xf) {
        local_48 = tcg_const_i32_aarch64(s_00,0);
      }
      else {
        pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
        local_48 = (TCGv_i32)((long)pTVar3 - (long)s_00);
        load_reg_var(s,local_48,iVar1);
      }
      if (len != 0x20) {
        iVar1 = a->rd;
        s_01 = s->uc->tcg_ctx;
        pTVar3 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
        var = (TCGv_i32)((long)pTVar3 - (long)s_01);
        load_reg_var(s,var,iVar1);
        tcg_gen_deposit_i32_aarch64(s_00,local_48,var,local_48,ofs,len);
        tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
      }
      store_reg(s,a->rd,local_48);
    }
  }
  return SUB41(((uint)uVar2 & 0x40) >> 6,0);
}

Assistant:

static bool trans_BFCI(DisasContext *s, arg_BFCI *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;
    int msb = a->msb, lsb = a->lsb;
    int width;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    if (msb < lsb) {
        /* UNPREDICTABLE; we choose to UNDEF */
        unallocated_encoding(s);
        return true;
    }

    width = msb + 1 - lsb;
    if (a->rn == 15) {
        /* BFC */
        tmp = tcg_const_i32(tcg_ctx, 0);
    } else {
        /* BFI */
        tmp = load_reg(s, a->rn);
    }
    if (width != 32) {
        TCGv_i32 tmp2 = load_reg(s, a->rd);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, lsb, width);
        tcg_temp_free_i32(tcg_ctx, tmp2);
    }
    store_reg(s, a->rd, tmp);
    return true;
}